

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::TriangleDraw::Run(TriangleDraw *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  GLuint GVar5;
  char *src_vs;
  char *src_fs;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  float *pfVar9;
  CallLogWrapper *pCVar10;
  Vector<float,_4> local_138;
  uint local_128;
  allocator<tcu::Vector<float,_4>_> local_121;
  uint i;
  undefined1 local_110 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> read;
  GLfloat buffData [16];
  GLuint l_vao;
  undefined1 local_a0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_78 [32];
  string local_58 [32];
  GLfloat aGStack_38 [2];
  GLfloat colorf [4];
  GLenum local_1c;
  TriangleDraw *pTStack_18;
  GLenum drawBuffer;
  TriangleDraw *this_local;
  
  pCVar10 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pTStack_18 = this;
  glu::CallLogWrapper::glGenFramebuffers(pCVar10,1,&this->fbo);
  glu::CallLogWrapper::glGenRenderbuffers(pCVar10,1,&this->rbo);
  glu::CallLogWrapper::glBindRenderbuffer(pCVar10,0x8d41,this->rbo);
  glu::CallLogWrapper::glRenderbufferStorage(pCVar10,0x8d41,0x8814,100,100);
  glu::CallLogWrapper::glBindFramebuffer(pCVar10,0x8d40,this->fbo);
  glu::CallLogWrapper::glFramebufferRenderbuffer(pCVar10,0x8d40,0x8ce0,0x8d41,this->rbo);
  local_1c = 0x8ce0;
  glu::CallLogWrapper::glDrawBuffers(pCVar10,1,&local_1c);
  aGStack_38[0] = 0.0;
  aGStack_38[1] = 0.0;
  colorf[0] = 0.0;
  colorf[1] = 0.0;
  glu::CallLogWrapper::glClearBufferfv(pCVar10,0x1800,0,aGStack_38);
  glu::CallLogWrapper::glViewport(pCVar10,0,0,100,100);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1a])()
  ;
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
            (local_78);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar5 = TGBase::CreateProgram((TGBase *)this,src_vs,(char *)0x0,(char *)0x0,(char *)0x0,src_fs);
  this->program = GVar5;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program,0,"Vertex");
  glu::CallLogWrapper::glBindFragDataLocation
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program,0,"FragColor");
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program);
  bVar4 = TGBase::CheckProgram((TGBase *)this,this->program,(bool *)0x0);
  if (bVar4) {
    pCVar10 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(pCVar10,this->program);
    glu::CallLogWrapper::glGenTextures(pCVar10,1,&(this->super_GatherBase).tex);
    glu::CallLogWrapper::glBindTexture(pCVar10,0xde1,(this->super_GatherBase).tex);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&l_vao,0.25,0.5,0.75,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a0,
               10000,(Vector<float,_4> *)&l_vao,
               (allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a0,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8814,100,100,0,0x1908,0x1406,pvVar6);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2802,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2803,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x8072,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,(GLuint *)(buffData + 0xe));
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(GLuint)buffData[0xe]);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->vbo);
    buffData[10] = 1.0;
    buffData[0xb] = -1.0;
    buffData[0xc] = 0.0;
    buffData[0xd] = 1.0;
    buffData[6] = 1.0;
    buffData[7] = 1.0;
    buffData[8] = 0.0;
    buffData[9] = 1.0;
    buffData[2] = -1.0;
    buffData[3] = -1.0;
    buffData[4] = 0.0;
    buffData[5] = 1.0;
    read.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x3f800000bf800000;
    buffData[0] = 0.0;
    buffData[1] = 1.0;
    glu::CallLogWrapper::glBufferData
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0x40,
               &read.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4);
    glu::CallLogWrapper::glDisableVertexAttribArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDeleteVertexArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,(GLuint *)(buffData + 0xe));
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0);
    glu::CallLogWrapper::glReadBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8ce0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&i,0.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_121);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_110,
               10000,(value_type *)&i,&local_121);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_121);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_110,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,100,100,0x1908,0x1406,pvVar6);
    local_128 = 0;
    while( true ) {
      uVar7 = (ulong)local_128;
      sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_110);
      if (sVar8 <= uVar7) break;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_110,(ulong)local_128);
      tcu::Vector<float,_4>::Vector(&local_138,0.75);
      bVar4 = tcu::Vector<float,_4>::operator!=(pvVar6,&local_138);
      if (bVar4) {
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_110,(ulong)local_128);
        pfVar9 = tcu::Vector<float,_4>::x(pvVar6);
        fVar1 = *pfVar9;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_110,(ulong)local_128);
        pfVar9 = tcu::Vector<float,_4>::y(pvVar6);
        fVar2 = *pfVar9;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_110,(ulong)local_128);
        pfVar9 = tcu::Vector<float,_4>::z(pvVar6);
        fVar3 = *pfVar9;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_110,(ulong)local_128);
        pfVar9 = tcu::Vector<float,_4>::w(pvVar6);
        anon_unknown_0::Output
                  ("Got: %f %f %f %f, expected vec4(0.25)",SUB84((double)fVar1,0),(double)fVar2,
                   (double)fVar3,(double)*pfVar9);
        this_local = (TriangleDraw *)&DAT_ffffffffffffffff;
        goto LAB_00f24435;
      }
      local_128 = local_128 + 1;
    }
    this_local = (TriangleDraw *)0x0;
LAB_00f24435:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_110);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a0);
  }
  else {
    this_local = (TriangleDraw *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 100, 100);

		program = CreateProgram(VertexShader().c_str(), NULL, NULL, NULL, FragmentShader().c_str());
		glBindAttribLocation(program, 0, "Vertex");
		glBindFragDataLocation(program, 0, "FragColor");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		std::vector<Vec4> data(100 * 100, Vec4(0.25, 0.5, 0.75, 1));
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 100, 100, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		GLuint l_vao;
		glGenVertexArrays(1, &l_vao);
		glBindVertexArray(l_vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		GLfloat buffData[16] = { -1, 1, 0, 1, -1, -1, 0, 1, 1, 1, 0, 1, 1, -1, 0, 1 };
		glBufferData(GL_ARRAY_BUFFER, sizeof(buffData), buffData, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(GLfloat) * 4, 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &l_vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT0);
		std::vector<Vec4> read(100 * 100, Vec4(0));
		glReadPixels(0, 0, 100, 100, GL_RGBA, GL_FLOAT, &read[0]);
		for (unsigned int i = 0; i < read.size(); ++i)
		{
			if (read[i] != Vec4(0.75))
			{
				Output("Got: %f %f %f %f, expected vec4(0.25)", read[i].x(), read[i].y(), read[i].z(), read[i].w());
				return ERROR;
			}
		}

		return NO_ERROR;
	}